

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O0

keypress * keymap_make(keypress *actions)

{
  keypress *__dest;
  long local_20;
  size_t n;
  keypress *new;
  keypress *actions_local;
  
  for (local_20 = 0; actions[local_20].type != EVT_NONE; local_20 = local_20 + 1) {
  }
  __dest = (keypress *)mem_zalloc((local_20 + 1) * 0xc);
  memcpy(__dest,actions,(local_20 + 1) * 0xc);
  __dest[local_20].type = EVT_NONE;
  return __dest;
}

Assistant:

static struct keypress *keymap_make(const struct keypress *actions)
{
	struct keypress *new;
	size_t n = 0;
	while (actions[n].type) {
		n++;
	}

	/* Make room for the terminator */
	n += 1;

	new = mem_zalloc(sizeof *new * n);
	memcpy(new, actions, sizeof *new * n);

	new[n - 1].type = EVT_NONE;

	return new;
}